

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_ext_pake_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  bool bVar1;
  int iVar2;
  uchar *data;
  size_t len;
  undefined1 local_80 [8];
  CBB pake_msg;
  CBB pake_ext;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = Array<unsigned_char>::empty(&hs->pake_share_bytes);
  if (bVar1) {
    hs_local._7_1_ = true;
  }
  else {
    iVar2 = CBB_add_u16(out,0x8a3b);
    if ((((iVar2 != 0) &&
         (iVar2 = CBB_add_u16_length_prefixed(out,(CBB *)((long)&pake_msg.u + 0x18)), iVar2 != 0))
        && (iVar2 = CBB_add_u16((CBB *)((long)&pake_msg.u + 0x18),0x7d96), iVar2 != 0)) &&
       (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&pake_msg.u + 0x18),(CBB *)local_80),
       iVar2 != 0)) {
      data = Array<unsigned_char>::data(&hs->pake_share_bytes);
      len = Array<unsigned_char>::size(&hs->pake_share_bytes);
      iVar2 = CBB_add_bytes((CBB *)local_80,data,len);
      if ((iVar2 != 0) && (iVar2 = CBB_flush(out), iVar2 != 0)) {
        return true;
      }
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_ext_pake_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (hs->pake_share_bytes.empty()) {
    return true;
  }

  CBB pake_ext, pake_msg;
  if (!CBB_add_u16(out, TLSEXT_TYPE_pake) ||
      !CBB_add_u16_length_prefixed(out, &pake_ext) ||
      !CBB_add_u16(&pake_ext, SSL_PAKE_SPAKE2PLUSV1) ||
      !CBB_add_u16_length_prefixed(&pake_ext, &pake_msg) ||
      !CBB_add_bytes(&pake_msg, hs->pake_share_bytes.data(),
                     hs->pake_share_bytes.size()) ||
      !CBB_flush(out)) {
    return false;
  }
  return true;
}